

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::PixelStatsAccumulator::ReportRatio
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t num,int64_t denom
          )

{
  Image *this_00;
  PixelStats *pPVar1;
  pointer pbVar2;
  char *pcVar3;
  pointer pIVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Allocator alloc;
  ulong uVar6;
  Point2i resolution;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  Point2i p_00;
  int iVar10;
  Float FVar11;
  Float FVar12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  ColorEncodingHandle local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  long *local_e8 [2];
  long local_d8 [2];
  Image local_c8;
  
  uVar9 = (ulong)statIndex;
  pPVar1 = this->stats;
  uVar6 = ((long)(pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pPVar1->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
  if (uVar6 < uVar9 || uVar6 - uVar9 == 0) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (&pPVar1->ratioImages,(long)(statIndex + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->stats->ratioNames,(long)(statIndex + 1));
    pbVar2 = (this->stats->ratioNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)pbVar2[uVar9]._M_string_length;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)(pbVar2 + uVar9),0,pcVar3,(ulong)name);
  }
  pIVar4 = (this->stats->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = pIVar4 + uVar9;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = imageBounds._8_4_ - imageBounds._0_4_;
  iVar10 = imageBounds._12_4_ - imageBounds._4_4_;
  TVar5 = pIVar4[uVar9].resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar5.y != iVar10 || TVar5.x != resolution.super_Tuple2<pbrt::Point2,_int>.x) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"numerator","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"denominator","");
    plVar8 = local_d8;
    local_e8[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"ratio","");
    resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar10;
    local_130.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 3;
    channels.ptr = &local_128;
    Image::Image(&local_c8,Float,resolution,channels,&local_130,alloc);
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.y =
         local_c8.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    this_00->format = local_c8.format;
    (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x =
         local_c8.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->channelNames,&local_c8.channelNames);
    (this_00->encoding).
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (uintptr_t)
            local_c8.encoding.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&this_00->p8,&local_c8.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&this_00->p16,&local_c8.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&this_00->p32,&local_c8.p32);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_c8.p32);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_c8.p16);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&local_c8.p8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.channelNames);
    lVar7 = -0x60;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x =
       (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds._0_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.y =
       (p->super_Tuple2<pbrt::Point2,_int>).y - imageBounds._4_4_;
  FVar11 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,0,FVar11 + (float)num);
  FVar11 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
  Image::SetChannel(this_00,p_00,1,FVar11 + (float)denom);
  FVar11 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
  FVar12 = 0.0;
  if ((FVar11 != 0.0) || (NAN(FVar11))) {
    FVar12 = Image::GetChannel(this_00,p_00,0,(WrapMode2D)0x200000002);
    FVar11 = Image::GetChannel(this_00,p_00,1,(WrapMode2D)0x200000002);
    FVar12 = FVar12 / FVar11;
  }
  Image::SetChannel(this_00,p_00,2,FVar12);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportRatio(const Point2i &p, int statIndex, const char *name,
                                        int64_t num, int64_t denom) {
    if (statIndex >= stats->ratioImages.size()) {
        stats->ratioImages.resize(statIndex + 1);
        stats->ratioNames.resize(statIndex + 1);
        stats->ratioNames[statIndex] = name;
    }

    Image &im = stats->ratioImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"numerator", "denominator", "ratio"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + num);
    im.SetChannel(pp, 1, im.GetChannel(pp, 1) + denom);
    if (im.GetChannel(pp, 0) == 0)
        im.SetChannel(pp, 2, 0);
    else
        im.SetChannel(pp, 2, im.GetChannel(pp, 0) / im.GetChannel(pp, 1));
}